

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no-prefix-set.cpp
# Opt level: O2

bool __thiscall Trie<char,_10UL,_'a'>::good(Trie<char,_10UL,__a_> *this,string *word)

{
  size_type sVar1;
  Trie<char,_10UL,__a_> *pTVar2;
  difference_type dVar3;
  long lVar4;
  int i;
  size_type sVar5;
  undefined8 local_38;
  
  sVar1 = word->_M_string_length;
  sVar5 = 0;
  do {
    if (sVar1 == sVar5) {
      this->counter = this->counter + 1;
      local_38 = 0;
      dVar3 = std::
              __count_if<Trie<char,10ul,(char)97>**,__gnu_cxx::__ops::_Iter_equals_val<decltype(nullptr)const>>
                        (this->nodes,(Trie<char,_10UL,__a_> **)&this->counter,
                         (_Iter_equals_val<const_std::nullptr_t>)&local_38);
      return dVar3 == 10;
    }
    lVar4 = (long)(word->_M_dataplus)._M_p[sVar5];
    pTVar2 = *(Trie<char,_10UL,__a_> **)((long)this + lVar4 * 8 + -0x308);
    if (pTVar2 == (Trie<char,_10UL,__a_> *)0x0) {
      pTVar2 = (Trie<char,_10UL,__a_> *)operator_new(0x58);
      pTVar2->nodes[0] = (Trie<char,_10UL,__a_> *)0x0;
      pTVar2->nodes[1] = (Trie<char,_10UL,__a_> *)0x0;
      pTVar2->nodes[2] = (Trie<char,_10UL,__a_> *)0x0;
      pTVar2->nodes[3] = (Trie<char,_10UL,__a_> *)0x0;
      pTVar2->nodes[4] = (Trie<char,_10UL,__a_> *)0x0;
      pTVar2->nodes[5] = (Trie<char,_10UL,__a_> *)0x0;
      pTVar2->nodes[6] = (Trie<char,_10UL,__a_> *)0x0;
      pTVar2->nodes[7] = (Trie<char,_10UL,__a_> *)0x0;
      pTVar2->nodes[8] = (Trie<char,_10UL,__a_> *)0x0;
      pTVar2->nodes[9] = (Trie<char,_10UL,__a_> *)0x0;
      pTVar2->counter = 0;
      *(Trie<char,_10UL,__a_> **)((long)this + lVar4 * 8 + -0x308) = pTVar2;
    }
    sVar5 = sVar5 + 1;
    this = pTVar2;
  } while (pTVar2->counter == 0);
  return false;
}

Assistant:

bool good(const std::string &word) {
    auto root = this;
    for (auto i = 0; i < word.size(); ++i) {
      auto index = word[i] - offset;
      if (root->nodes[index] == nullptr) {
        root->nodes[index] = new Trie<Element, N, offset>();
      }
      root = root->nodes[index];
      if (root->counter != 0) {
        return false;
      }
    }
    root->counter += 1;
    return std::count(root->nodes, root->nodes + N, nullptr) == N;
  }